

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O2

void __thiscall OpenMD::AngleR::writeAngleR(AngleR *this)

{
  char cVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  Revision rev;
  string local_248;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out)
  ;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"AngleR: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar2 = std::operator<<((ostream *)&ofs,"# ");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).analysisType_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&ofs,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_248,&rev);
    poVar2 = std::operator<<(poVar2,(string *)&local_248);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_248);
    poVar2 = std::operator<<((ostream *)&ofs,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_248,&rev);
    poVar2 = std::operator<<(poVar2,(string *)&local_248);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_248);
    poVar2 = std::operator<<((ostream *)&ofs,"#nFrames:\t");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->nProcessed_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&ofs,"#selection1: (");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript1_);
    std::operator<<(poVar2,")");
    if (this->doVect_ == false) {
      poVar2 = std::operator<<((ostream *)&ofs,"\tselection2: (");
      poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript2_);
      std::operator<<(poVar2,")");
    }
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      poVar2 = std::operator<<((ostream *)&ofs,"# parameters: ");
      poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).paramString_);
      std::operator<<(poVar2,"\n");
    }
    std::operator<<((ostream *)&ofs,"#r\tcorrValue\n");
    for (uVar3 = 0; uVar4 = (ulong)uVar3,
        uVar4 < (ulong)((long)(this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
      poVar2 = std::ostream::_M_insert<double>(((double)uVar4 + 0.5) * this->deltaR_);
      std::operator<<(poVar2,"\t");
      poVar2 = std::ostream::_M_insert<double>
                         ((this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar2,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void AngleR::writeAngleR() {
    std::ofstream ofs(outputFilename_.c_str());
    if (ofs.is_open()) {
      Revision rev;

      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << rev.getFullRevision() << "\n";
      ofs << "# " << rev.getBuildDate() << "\n";
      ofs << "#nFrames:\t" << nProcessed_ << "\n";
      ofs << "#selection1: (" << selectionScript1_ << ")";
      if (!doVect_) { ofs << "\tselection2: (" << selectionScript2_ << ")"; }
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      ofs << "#r\tcorrValue\n";
      for (unsigned int i = 0; i < avgAngleR_.size(); ++i) {
        RealType r = deltaR_ * (i + 0.5);
        ofs << r << "\t" << avgAngleR_[i] << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "AngleR: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }